

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O3

void __thiscall
NLProblemBuilderTest_OnHeader_Test::TestBody(NLProblemBuilderTest_OnHeader_Test *this)

{
  FunctionMocker<void_(const_mp::NLProblemInfo_&)> *this_00;
  MockSpec<void_(const_mp::NLProblemInfo_&)> *this_01;
  NLHeader h;
  Matcher<const_mp::NLProblemInfo_&> local_148;
  NLHeader local_130;
  
  memset(&local_130,0,0xa8);
  local_130.super_NLInfo.super_NLInfo_C.format = 1;
  local_130.super_NLInfo.super_NLInfo_C.num_ampl_options = 3;
  local_130.super_NLInfo.super_NLInfo_C.prob_name = "nl_instance";
  local_130.super_NLInfo.super_NLInfo_C.ampl_vbtol = 0.0;
  local_130.super_NLInfo.super_NLInfo_C.arith_kind = 1;
  local_130.super_NLInfo.super_NLInfo_C.flags = 1;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[3] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[4] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[5] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[6] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[7] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[8] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[2] = 0;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[0] = 1;
  local_130.super_NLInfo.super_NLInfo_C.ampl_options[1] = 1;
  local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_.value_ =
       (MatcherInterface<const_mp::NLProblemInfo_&> *)operator_new(0x10);
  ((local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_.value_)->
  super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_002f8b28;
  local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_.value_[1].
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)&local_130;
  local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_.link_.next_ =
       &local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_.link_;
  local_148.super_MatcherBase<const_mp::NLProblemInfo_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1030;
  this_00 = &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder.gmock1_SetInfo_152;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_00,
             &(this->super_NLProblemBuilderTest).builder.super_MockProblemBuilder);
  this_01 = testing::internal::FunctionMocker<void_(const_mp::NLProblemInfo_&)>::With
                      (this_00,&local_148);
  testing::internal::MockSpec<void_(const_mp::NLProblemInfo_&)>::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0x70b,"builder","SetInfo(testing::Ref(h))");
  local_148.super_MatcherBase<const_mp::NLProblemInfo_&>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002f1078;
  testing::internal::linked_ptr<const_testing::MatcherInterface<const_mp::NLProblemInfo_&>_>::
  ~linked_ptr(&local_148.super_MatcherBase<const_mp::NLProblemInfo_&>.impl_);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::OnHeader
            (&(this->super_NLProblemBuilderTest).adapter,&local_130);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnHeader) {
  NLHeader h;
  EXPECT_CALL(builder, SetInfo(testing::Ref(h)));
  adapter.OnHeader(h);
}